

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O0

float __thiscall
poisson_loss::getLoss(poisson_loss *this,shared_data *param_2,float prediction,float label)

{
  ostream *poVar1;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float in_XMM1_Da;
  float exp_prediction;
  
  if (in_XMM1_Da < 0.0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"You are using label ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM1_Da);
    poVar1 = std::operator<<(poVar1," but loss function expects label >= 0!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  fVar2 = expf(in_XMM0_Da);
  fVar3 = logf(in_XMM1_Da + 1e-06);
  return (in_XMM1_Da * (fVar3 - in_XMM0_Da) + -(in_XMM1_Da - fVar2)) * 2.0;
}

Assistant:

float getLoss(shared_data*, float prediction, float label)
  {
    if (label < 0.f)
      cout << "You are using label " << label << " but loss function expects label >= 0!" << endl;
    float exp_prediction = expf(prediction);
    // deviance is used instead of log-likelihood
    return 2 * (label * (logf(label + 1e-6f) - prediction) - (label - exp_prediction));
  }